

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz_issue_tests.cpp
# Opt level: O0

void __thiscall measProblems_measFiles_Test::TestBody(measProblems_measFiles_Test *this)

{
  bool bVar1;
  ParamType *pPVar2;
  uint64_t uVar3;
  precise_measurement *measure;
  char *pcVar4;
  uint64_t in_RCX;
  char *in_R9;
  measurement mVar5;
  precise_unit pVar6;
  bool local_512;
  string local_4c0;
  AssertHelper local_4a0;
  Message local_498;
  bool local_489;
  undefined1 local_488 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_458;
  Message local_450;
  bool local_441;
  undefined1 local_440 [8];
  AssertionResult gtest_ar__6;
  unit local_420;
  unit uc2;
  unit local_408;
  unit uc1;
  AssertHelper local_3e0;
  Message local_3d8;
  bool local_3c9;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_398;
  Message local_390;
  bool local_381;
  undefined1 local_380 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_350;
  Message local_348;
  measurement local_340;
  measurement local_330;
  bool local_319;
  undefined1 local_318 [8];
  AssertionResult gtest_ar__3;
  Message local_300;
  measurement local_2f8;
  measurement local_2e8;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_2;
  string local_2b0;
  AssertHelper local_290;
  Message local_288;
  measurement local_280;
  measurement local_270;
  bool local_259;
  undefined1 local_258 [8];
  AssertionResult gtest_ar__2;
  Message local_240;
  measurement local_238;
  measurement local_228;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_1;
  string local_1f0;
  AssertHelper local_1d0;
  Message local_1c8;
  bool local_1b9;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar__1;
  Message local_1a0;
  undefined1 local_198 [8];
  AssertionResult gtest_ar;
  measurement mc1;
  measurement mc2;
  string local_160;
  AssertHelper local_140;
  Message local_138;
  precise_unit local_130;
  precise_unit local_120;
  bool local_109;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_;
  undefined1 local_d8 [8];
  precise_measurement m2;
  string str;
  undefined1 local_80 [8];
  precise_measurement m1;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  string cdata;
  measProblems_measFiles_Test *this_local;
  
  cdata.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"meas_fail",&local_51);
  pPVar2 = testing::WithParamInterface<int>::GetParam();
  loadFailureFile((string *)local_30,&local_50,*pPVar2);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::__cxx11::string::string((string *)(str.field_2._M_local_buf + 8),(string *)local_30);
  uVar3 = units::getDefaultFlags();
  units::measurement_from_string
            ((precise_measurement *)local_80,(string *)((long)&str.field_2 + 8),uVar3);
  std::__cxx11::string::~string((string *)(str.field_2._M_local_buf + 8));
  bVar1 = units::isnormal((precise_measurement *)local_80);
  if (!bVar1) goto LAB_001418f5;
  measure = (precise_measurement *)units::getDefaultFlags();
  units::to_string_abi_cxx11_((string *)&m2.units_.base_units_,(units *)local_80,measure,in_RCX);
  std::__cxx11::string::string((string *)&gtest_ar_.message_,(string *)&m2.units_.base_units_);
  uVar3 = units::getDefaultFlags();
  units::measurement_from_string
            ((precise_measurement *)local_d8,(string *)&gtest_ar_.message_,uVar3);
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  local_120 = units::precise_measurement::units((precise_measurement *)local_d8);
  local_130 = units::precise_measurement::units((precise_measurement *)local_80);
  bVar1 = units::precise_unit::has_same_base(&local_120,&local_130);
  local_512 = true;
  if (!bVar1) {
    local_512 = units::isnormal((precise_measurement *)local_d8);
  }
  local_109 = local_512;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_108,&local_109,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_160,(internal *)local_108,
               (AssertionResult *)"m2.units().has_same_base(m1.units()) || isnormal(m2)","false",
               "true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
               ,0x153,pcVar4);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  if (bVar1) {
    mVar5 = units::measurement_cast((precise_measurement *)local_d8);
    mc1.units_ = (unit)mVar5.value_;
    mVar5 = units::measurement_cast((precise_measurement *)local_80);
    mc1.value_ = (double)mVar5.units_;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )mVar5.value_;
    bVar1 = units::precise_measurement::operator==
                      ((precise_measurement *)local_d8,(precise_measurement *)local_80);
    if (bVar1) {
      testing::internal::EqHelper::
      Compare<units::precise_measurement,_units::precise_measurement,_nullptr>
                ((EqHelper *)local_198,"m2","m1",(precise_measurement *)local_d8,
                 (precise_measurement *)local_80);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
      if (!bVar1) {
        testing::Message::Message(&local_1a0);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
                   ,0x157,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_1a0)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
        testing::Message::~Message(&local_1a0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
      bVar1 = units::precise_measurement::operator!=
                        ((precise_measurement *)local_d8,(precise_measurement *)local_80);
      local_1b9 = (bool)(~bVar1 & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_1b8,&local_1b9,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
      if (!bVar1) {
        testing::Message::Message(&local_1c8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_1f0,(internal *)local_1b8,(AssertionResult *)"m2 != m1","true","false",
                   in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
                   ,0x158,pcVar4);
        testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
        testing::internal::AssertHelper::~AssertHelper(&local_1d0);
        std::__cxx11::string::~string((string *)&local_1f0);
        testing::Message::~Message(&local_1c8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
    }
    else {
      units::root((precise_measurement *)&gtest_ar_1.message_,(precise_measurement *)local_d8,2);
      bVar1 = units::isnormal((precise_measurement *)&gtest_ar_1.message_);
      if (bVar1) {
        local_228 = units::root((measurement *)&mc1.units_,2);
        local_238 = units::root((measurement *)&gtest_ar.message_,2);
        testing::internal::EqHelper::Compare<units::measurement,_units::measurement,_nullptr>
                  ((EqHelper *)local_218,"root(mc2, 2)","root(mc1, 2)",&local_228,&local_238);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
        if (!bVar1) {
          testing::Message::Message(&local_240);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
                     ,0x15a,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__2.message_,&local_240);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
          testing::Message::~Message(&local_240);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
        local_270 = units::root((measurement *)&mc1.units_,2);
        local_280 = units::root((measurement *)&gtest_ar.message_,2);
        bVar1 = units::measurement::operator!=(&local_270,&local_280);
        local_259 = (bool)(~bVar1 & 1);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_258,&local_259,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
        if (!bVar1) {
          testing::Message::Message(&local_288);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_2b0,(internal *)local_258,
                     (AssertionResult *)"root(mc2, 2) != root(mc1, 2)","true","false",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_290,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
                     ,0x15b,pcVar4);
          testing::internal::AssertHelper::operator=(&local_290,&local_288);
          testing::internal::AssertHelper::~AssertHelper(&local_290);
          std::__cxx11::string::~string((string *)&local_2b0);
          testing::Message::~Message(&local_288);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
      }
      else {
        units::root((precise_measurement *)&gtest_ar_2.message_,(precise_measurement *)local_d8,3);
        bVar1 = units::isnormal((precise_measurement *)&gtest_ar_2.message_);
        if (bVar1) {
          local_2e8 = units::root((measurement *)&mc1.units_,3);
          local_2f8 = units::root((measurement *)&gtest_ar.message_,3);
          testing::internal::EqHelper::Compare<units::measurement,_units::measurement,_nullptr>
                    ((EqHelper *)local_2d8,"root(mc2, 3)","root(mc1, 3)",&local_2e8,&local_2f8);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
          if (!bVar1) {
            testing::Message::Message(&local_300);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2d8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
                       ,0x15d,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__3.message_,&local_300);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
            testing::Message::~Message(&local_300);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
          local_330 = units::root((measurement *)&mc1.units_,3);
          local_340 = units::root((measurement *)&gtest_ar.message_,3);
          bVar1 = units::measurement::operator!=(&local_330,&local_340);
          local_319 = (bool)(~bVar1 & 1);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_318,&local_319,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
          if (!bVar1) {
            testing::Message::Message(&local_348);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__4.message_,(internal *)local_318,
                       (AssertionResult *)"root(mc2, 3) != root(mc1, 3)","true","false",in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_350,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
                       ,0x15e,pcVar4);
            testing::internal::AssertHelper::operator=(&local_350,&local_348);
            testing::internal::AssertHelper::~AssertHelper(&local_350);
            std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
            testing::Message::~Message(&local_348);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
        }
        else {
          bVar1 = units::isnormal((measurement *)&gtest_ar.message_);
          if (bVar1) {
            bVar1 = units::isnormal((measurement *)&mc1.units_);
            if (!bVar1) goto LAB_001414f1;
            local_381 = units::measurement::operator==
                                  ((measurement *)&mc1.units_,(measurement *)&gtest_ar.message_);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_380,&local_381,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
            if (!bVar1) {
              testing::Message::Message(&local_390);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__5.message_,(internal *)local_380,
                         (AssertionResult *)"mc2 == mc1","false","true",in_R9);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_398,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
                         ,0x160,pcVar4);
              testing::internal::AssertHelper::operator=(&local_398,&local_390);
              testing::internal::AssertHelper::~AssertHelper(&local_398);
              std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
              testing::Message::~Message(&local_390);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
            bVar1 = units::measurement::operator!=
                              ((measurement *)&mc1.units_,(measurement *)&gtest_ar.message_);
            local_3c9 = (bool)(~bVar1 & 1);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_3c8,&local_3c9,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
            if (!bVar1) {
              testing::Message::Message(&local_3d8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&uc1,(internal *)local_3c8,(AssertionResult *)"mc2 != mc1","true"
                         ,"false",in_R9);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_3e0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
                         ,0x161,pcVar4);
              testing::internal::AssertHelper::operator=(&local_3e0,&local_3d8);
              testing::internal::AssertHelper::~AssertHelper(&local_3e0);
              std::__cxx11::string::~string((string *)&uc1);
              testing::Message::~Message(&local_3d8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
          }
          else {
LAB_001414f1:
            pVar6 = units::precise_measurement::as_unit((precise_measurement *)local_80);
            uc2 = (unit)pVar6.multiplier_;
            local_408 = units::unit_cast((precise_unit *)&uc2);
            pVar6 = units::precise_measurement::as_unit((precise_measurement *)local_d8);
            gtest_ar__6.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )pVar6.multiplier_;
            local_420 = units::unit_cast((precise_unit *)&gtest_ar__6.message_);
            local_441 = units::unit::operator==(&local_420,&local_408);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_440,&local_441,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
            if (!bVar1) {
              testing::Message::Message(&local_450);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__7.message_,(internal *)local_440,
                         (AssertionResult *)"uc2 == uc1","false","true",in_R9);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_458,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
                         ,0x165,pcVar4);
              testing::internal::AssertHelper::operator=(&local_458,&local_450);
              testing::internal::AssertHelper::~AssertHelper(&local_458);
              std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
              testing::Message::~Message(&local_450);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
            bVar1 = units::unit::operator!=(&local_420,&local_408);
            local_489 = (bool)(~bVar1 & 1);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_488,&local_489,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
            if (!bVar1) {
              testing::Message::Message(&local_498);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_4c0,(internal *)local_488,(AssertionResult *)"uc2 != uc1","true",
                         "false",in_R9);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_4a0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
                         ,0x166,pcVar4);
              testing::internal::AssertHelper::operator=(&local_4a0,&local_498);
              testing::internal::AssertHelper::~AssertHelper(&local_4a0);
              std::__cxx11::string::~string((string *)&local_4c0);
              testing::Message::~Message(&local_498);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&m2.units_.base_units_);
LAB_001418f5:
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_P(measProblems, measFiles)
{
    auto cdata = loadFailureFile("meas_fail", GetParam());
    auto m1 = measurement_from_string(cdata);
    if (isnormal(m1)) {
        auto str = to_string(m1);
        auto m2 = measurement_from_string(str);
        ASSERT_TRUE(m2.units().has_same_base(m1.units()) || isnormal(m2));
        auto mc2 = measurement_cast(m2);
        auto mc1 = measurement_cast(m1);
        if (m2 == m1) {
            EXPECT_EQ(m2, m1);
            EXPECT_FALSE(m2 != m1);
        } else if (isnormal(root(m2, 2))) {
            EXPECT_EQ(root(mc2, 2), root(mc1, 2));
            EXPECT_FALSE(root(mc2, 2) != root(mc1, 2));
        } else if (isnormal(root(m2, 3))) {
            EXPECT_EQ(root(mc2, 3), root(mc1, 3));
            EXPECT_FALSE(root(mc2, 3) != root(mc1, 3));
        } else if (isnormal(mc1) && isnormal(mc2)) {
            EXPECT_TRUE(mc2 == mc1);
            EXPECT_FALSE(mc2 != mc1);
        } else {
            auto uc1 = unit_cast(m1.as_unit());
            auto uc2 = unit_cast(m2.as_unit());
            EXPECT_TRUE(uc2 == uc1);
            EXPECT_FALSE(uc2 != uc1);
        }
    }
}